

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

bool __thiscall
ArgsManager::ReadConfigFiles(ArgsManager *this,string *error,bool ignore_invalid_keys)

{
  string_view source_file;
  string_view logging_function;
  undefined1 uVar1;
  byte bVar2;
  undefined1 uVar3;
  byte bVar4;
  bool bVar5;
  __type_conflict1 _Var6;
  anon_class_16_2_d914f46d *this_00;
  string *psVar7;
  size_t sVar8;
  reference pbVar9;
  size_t in_RDI;
  long in_FS_OFFSET;
  string *conf_file_name_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  string *conf_file_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  size_t default_includes;
  size_t chain_includes;
  mapped_type *includes;
  bool use_conf_file;
  iterator __end3_1;
  iterator __begin3_1;
  iterator __end3;
  iterator __begin3;
  anon_class_16_2_d914f46d add_includes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  conf_file_names;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock3;
  string chain_id_final;
  ifstream conf_file_stream;
  string chain_id;
  ifstream stream;
  path conf_path;
  undefined4 in_stack_fffffffffffff758;
  openmode in_stack_fffffffffffff75c;
  char *in_stack_fffffffffffff760;
  reference in_stack_fffffffffffff768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff770;
  undefined4 in_stack_fffffffffffff778;
  int in_stack_fffffffffffff77c;
  undefined7 in_stack_fffffffffffff780;
  undefined1 in_stack_fffffffffffff787;
  ArgsManager *in_stack_fffffffffffff788;
  string *psVar10;
  ArgsManager *in_stack_fffffffffffff790;
  undefined7 in_stack_fffffffffffff798;
  undefined1 in_stack_fffffffffffff79f;
  string *in_stack_fffffffffffff7a0;
  undefined6 in_stack_fffffffffffff7a8;
  undefined1 in_stack_fffffffffffff7ae;
  byte in_stack_fffffffffffff7af;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7b8;
  undefined1 *flag;
  undefined8 in_stack_fffffffffffff7e8;
  undefined1 in_stack_fffffffffffff7f0;
  undefined1 in_stack_fffffffffffff7f1;
  undefined1 in_stack_fffffffffffff7f2;
  byte in_stack_fffffffffffff7f5;
  byte bVar11;
  byte bVar12;
  istream *stream_00;
  ConstevalFormatString<1U> fmt;
  char *pcVar13;
  size_t in_stack_fffffffffffff820;
  char *in_stack_fffffffffffff828;
  byte local_76b;
  string local_76a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_730;
  undefined1 *local_720;
  undefined1 local_718 [24];
  Level in_stack_fffffffffffff900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff910;
  string local_628 [4];
  undefined1 local_598 [520];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390 [6];
  undefined1 local_2d0 [520];
  undefined1 local_c8 [192];
  long local_8;
  
  uVar3 = (undefined1)((ulong)in_stack_fffffffffffff7e8 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
             &in_stack_fffffffffffff790->cs_args,(char *)in_stack_fffffffffffff788,
             (char *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
             in_stack_fffffffffffff77c,SUB41((uint)in_stack_fffffffffffff778 >> 0x18,0));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
  ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
           *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
  std::__cxx11::list<SectionInfo,_std::allocator<SectionInfo>_>::clear
            ((list<SectionInfo,_std::allocator<SectionInfo>_> *)
             CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
  pcVar13 = &stack0xfffffffffffff917;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff7af,
                      CONCAT16(in_stack_fffffffffffff7ae,in_stack_fffffffffffff7a8)),
             (char *)in_stack_fffffffffffff7a0,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798));
  fs::path::path((path *)0x191c55,
                 (char *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
  GetPathArg((ArgsManager *)
             CONCAT17(in_stack_fffffffffffff7af,
                      CONCAT16(in_stack_fffffffffffff7ae,in_stack_fffffffffffff7a8)),
             in_stack_fffffffffffff7a0,
             (path *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798));
  AbsPathForConfigVal(in_stack_fffffffffffff788,
                      (path *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
                      SUB41((uint)in_stack_fffffffffffff77c >> 0x18,0));
  stream_00 = (istream *)(local_c8 + 0x98);
  std::optional<fs::path>::operator=
            ((optional<fs::path> *)in_stack_fffffffffffff768,(path *)in_stack_fffffffffffff760);
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff917);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
  fmt.fmt = local_c8;
  GetConfigFilePath(in_stack_fffffffffffff790);
  std::ifstream::ifstream<fs::path,fs::path>
            ((basic_ifstream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff768,
             (path *)in_stack_fffffffffffff760,in_stack_fffffffffffff75c);
  psVar10 = (string *)&stack0xfffffffffffff916;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff7af,
                      CONCAT16(in_stack_fffffffffffff7ae,in_stack_fffffffffffff7a8)),
             (char *)in_stack_fffffffffffff7a0,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798));
  uVar1 = IsArgSet((ArgsManager *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
                   (string *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
  bVar11 = 0;
  if ((bool)uVar1) {
    in_stack_fffffffffffff7f5 = std::ios::good();
    bVar11 = in_stack_fffffffffffff7f5 ^ 0xff;
  }
  bVar12 = bVar11;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff916);
  if ((bVar11 & 1) == 0) {
    bVar2 = std::ios::good();
    if ((bVar2 & 1) != 0) {
      fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffff760);
      uVar3 = ReadConfigStream((ArgsManager *)fmt.fmt,stream_00,psVar10,
                               (string *)
                               CONCAT17(uVar1,CONCAT16(bVar12,CONCAT15(in_stack_fffffffffffff7f5,
                                                                       CONCAT14(bVar11,CONCAT13(
                                                  bVar2,CONCAT12(in_stack_fffffffffffff7f2,
                                                                 CONCAT11(in_stack_fffffffffffff7f1,
                                                                          in_stack_fffffffffffff7f0)
                                                                )))))),(bool)uVar3);
      bVar4 = uVar3 ^ 0xff;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
      if ((bVar4 & 1) != 0) {
        local_76b = 0;
        goto LAB_00192a39;
      }
      bVar5 = true;
      this_00 = (anon_class_16_2_d914f46d *)
                MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                          ((AnnotatedMixin<std::recursive_mutex> *)
                           CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
                 &in_stack_fffffffffffff790->cs_args,(char *)in_stack_fffffffffffff788,
                 (char *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
                 in_stack_fffffffffffff77c,SUB41((uint)in_stack_fffffffffffff778 >> 0x18,0));
      psVar7 = (string *)
               common::
               FindKey<std::map<std::__cxx11::string,std::vector<UniValue,std::allocator<UniValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<UniValue,std::allocator<UniValue>>>>>&,char_const(&)[12]>
                         ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                           *)in_stack_fffffffffffff7a0,
                          (char (*) [12])
                          CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798));
      if (psVar7 != (string *)0x0) {
        common::SettingsSpan::SettingsSpan
                  ((SettingsSpan *)in_stack_fffffffffffff768,
                   (vector<UniValue,_std::allocator<UniValue>_> *)in_stack_fffffffffffff760);
        bVar5 = common::SettingsSpan::last_negated((SettingsSpan *)in_stack_fffffffffffff768);
        if (!bVar5) {
          __assert_fail("common::SettingsSpan(*includes).last_negated()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/config.cpp"
                        ,0x96,"bool ArgsManager::ReadConfigFiles(std::string &, bool)");
        }
        bVar5 = false;
      }
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
      if (bVar5) {
        GetChainTypeString_abi_cxx11_(in_stack_fffffffffffff788);
        flag = local_718;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
        local_720 = flag;
        sVar8 = ReadConfigFiles::anon_class_16_2_d914f46d::operator()
                          (this_00,psVar7,(size_t)fmt.fmt);
        in_stack_fffffffffffff7b0 = local_390;
        std::__cxx11::string::string(in_stack_fffffffffffff770);
        in_stack_fffffffffffff7b8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ReadConfigFiles::anon_class_16_2_d914f46d::operator()(this_00,psVar7,(size_t)fmt.fmt);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
        local_730 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffff760);
        local_738 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff760);
        while (bVar5 = __gnu_cxx::
                       operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_fffffffffffff768,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_fffffffffffff760), ((bVar5 ^ 0xffU) & 1) != 0) {
          pbVar9 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
          fs::PathFromString((string *)in_stack_fffffffffffff788);
          AbsPathForConfigVal(in_stack_fffffffffffff788,
                              (path *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
                              SUB41((uint)in_stack_fffffffffffff77c >> 0x18,0));
          std::ifstream::ifstream<fs::path,fs::path>
                    ((basic_ifstream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff768,
                     (path *)in_stack_fffffffffffff760,in_stack_fffffffffffff75c);
          fs::path::~path((path *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
          fs::path::~path((path *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
          in_stack_fffffffffffff7af = std::ios::good();
          if ((in_stack_fffffffffffff7af & 1) == 0) {
            std::operator+((char *)CONCAT17(in_stack_fffffffffffff7af,
                                            CONCAT16(in_stack_fffffffffffff7ae,
                                                     in_stack_fffffffffffff7a8)),
                           in_stack_fffffffffffff7a0);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
            local_76b = 0;
            bVar5 = true;
          }
          else {
            in_stack_fffffffffffff7ae =
                 ReadConfigStream((ArgsManager *)fmt.fmt,stream_00,psVar10,
                                  (string *)
                                  CONCAT17(uVar1,CONCAT16(bVar12,CONCAT15(in_stack_fffffffffffff7f5,
                                                                          CONCAT14(bVar11,CONCAT13(
                                                  bVar2,CONCAT12(uVar3,CONCAT11(bVar4,
                                                  in_stack_fffffffffffff7f0))))))),
                                  SUB81((ulong)this_00 >> 0x38,0));
            if ((bool)in_stack_fffffffffffff7ae) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
                         (char *)in_stack_fffffffffffff770);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
                         (char *)in_stack_fffffffffffff770);
              in_stack_fffffffffffff760 = "Included configuration file %s\n";
              in_stack_fffffffffffff758 = 2;
              logging_function._M_str = in_stack_fffffffffffff828;
              logging_function._M_len = in_stack_fffffffffffff820;
              source_file._M_str = pcVar13;
              source_file._M_len = in_RDI;
              LogPrintFormatInternal<std::__cxx11::string>
                        (logging_function,source_file,(int)(sVar8 >> 0x20),(LogFlags)flag,
                         in_stack_fffffffffffff900,fmt,in_stack_fffffffffffff910);
              bVar5 = false;
              in_stack_fffffffffffff768 = pbVar9;
            }
            else {
              local_76b = 0;
              bVar5 = true;
            }
          }
          std::ifstream::~ifstream(local_598);
          if (bVar5) goto LAB_001927e2;
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
        ReadConfigFiles::anon_class_16_2_d914f46d::operator()(this_00,psVar7,(size_t)fmt.fmt);
        in_stack_fffffffffffff7a0 = local_628;
        std::__cxx11::string::string(in_stack_fffffffffffff770);
        ReadConfigFiles::anon_class_16_2_d914f46d::operator()(this_00,psVar7,(size_t)fmt.fmt);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
        GetChainTypeString_abi_cxx11_(in_stack_fffffffffffff788);
        _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff788,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
        if (((_Var6 ^ 0xffU) & 1) != 0) {
          ReadConfigFiles::anon_class_16_2_d914f46d::operator()(this_00,psVar7,(size_t)fmt.fmt);
        }
        local_76a._10_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff760);
        local_76a._2_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff760);
        while (bVar5 = __gnu_cxx::
                       operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_fffffffffffff768,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_fffffffffffff760), ((bVar5 ^ 0xffU) & 1) != 0) {
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
          tinyformat::format<std::__cxx11::string>
                    ((ostream *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780),
                     (char *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778),
                     in_stack_fffffffffffff770);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
        bVar5 = false;
LAB_001927e2:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff768);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
        if (bVar5) goto LAB_00192a39;
      }
    }
    ClearPathCache(in_stack_fffffffffffff788);
    uVar1 = CheckDataDirOption(in_stack_fffffffffffff788);
    if ((bool)uVar1) {
      local_76b = 1;
    }
    else {
      psVar7 = (string *)((long)&local_76a._M_dataplus._M_p + 1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff7af,
                          CONCAT16(in_stack_fffffffffffff7ae,in_stack_fffffffffffff7a8)),
                 (char *)in_stack_fffffffffffff7a0,
                 (allocator<char> *)CONCAT17(uVar1,in_stack_fffffffffffff798));
      psVar10 = &local_76a;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff7af,
                          CONCAT16(in_stack_fffffffffffff7ae,in_stack_fffffffffffff7a8)),
                 (char *)in_stack_fffffffffffff7a0,
                 (allocator<char> *)CONCAT17(uVar1,in_stack_fffffffffffff798));
      GetArg((ArgsManager *)CONCAT17(uVar1,in_stack_fffffffffffff798),psVar7,psVar10);
      tinyformat::format<std::__cxx11::string>
                ((char *)psVar10,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
      std::allocator<char>::~allocator((allocator<char> *)&local_76a);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
      std::allocator<char>::~allocator((allocator<char> *)((long)&local_76a._M_dataplus._M_p + 1));
      local_76b = 0;
    }
  }
  else {
    fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffff760);
    tinyformat::format<std::__cxx11::string>
              ((char *)in_stack_fffffffffffff788,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
    local_76b = 0;
  }
LAB_00192a39:
  std::ifstream::~ifstream(local_2d0);
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_76b & 1);
}

Assistant:

bool ArgsManager::ReadConfigFiles(std::string& error, bool ignore_invalid_keys)
{
    {
        LOCK(cs_args);
        m_settings.ro_config.clear();
        m_config_sections.clear();
        m_config_path = AbsPathForConfigVal(*this, GetPathArg("-conf", BITCOIN_CONF_FILENAME), /*net_specific=*/false);
    }

    const auto conf_path{GetConfigFilePath()};
    std::ifstream stream{conf_path};

    // not ok to have a config file specified that cannot be opened
    if (IsArgSet("-conf") && !stream.good()) {
        error = strprintf("specified config file \"%s\" could not be opened.", fs::PathToString(conf_path));
        return false;
    }
    // ok to not have a config file
    if (stream.good()) {
        if (!ReadConfigStream(stream, fs::PathToString(conf_path), error, ignore_invalid_keys)) {
            return false;
        }
        // `-includeconf` cannot be included in the command line arguments except
        // as `-noincludeconf` (which indicates that no included conf file should be used).
        bool use_conf_file{true};
        {
            LOCK(cs_args);
            if (auto* includes = common::FindKey(m_settings.command_line_options, "includeconf")) {
                // ParseParameters() fails if a non-negated -includeconf is passed on the command-line
                assert(common::SettingsSpan(*includes).last_negated());
                use_conf_file = false;
            }
        }
        if (use_conf_file) {
            std::string chain_id = GetChainTypeString();
            std::vector<std::string> conf_file_names;

            auto add_includes = [&](const std::string& network, size_t skip = 0) {
                size_t num_values = 0;
                LOCK(cs_args);
                if (auto* section = common::FindKey(m_settings.ro_config, network)) {
                    if (auto* values = common::FindKey(*section, "includeconf")) {
                        for (size_t i = std::max(skip, common::SettingsSpan(*values).negated()); i < values->size(); ++i) {
                            conf_file_names.push_back((*values)[i].get_str());
                        }
                        num_values = values->size();
                    }
                }
                return num_values;
            };

            // We haven't set m_network yet (that happens in SelectParams()), so manually check
            // for network.includeconf args.
            const size_t chain_includes = add_includes(chain_id);
            const size_t default_includes = add_includes({});

            for (const std::string& conf_file_name : conf_file_names) {
                std::ifstream conf_file_stream{AbsPathForConfigVal(*this, fs::PathFromString(conf_file_name), /*net_specific=*/false)};
                if (conf_file_stream.good()) {
                    if (!ReadConfigStream(conf_file_stream, conf_file_name, error, ignore_invalid_keys)) {
                        return false;
                    }
                    LogPrintf("Included configuration file %s\n", conf_file_name);
                } else {
                    error = "Failed to include configuration file " + conf_file_name;
                    return false;
                }
            }

            // Warn about recursive -includeconf
            conf_file_names.clear();
            add_includes(chain_id, /* skip= */ chain_includes);
            add_includes({}, /* skip= */ default_includes);
            std::string chain_id_final = GetChainTypeString();
            if (chain_id_final != chain_id) {
                // Also warn about recursive includeconf for the chain that was specified in one of the includeconfs
                add_includes(chain_id_final);
            }
            for (const std::string& conf_file_name : conf_file_names) {
                tfm::format(std::cerr, "warning: -includeconf cannot be used from included files; ignoring -includeconf=%s\n", conf_file_name);
            }
        }
    }

    // If datadir is changed in .conf file:
    ClearPathCache();
    if (!CheckDataDirOption(*this)) {
        error = strprintf("specified data directory \"%s\" does not exist.", GetArg("-datadir", ""));
        return false;
    }
    return true;
}